

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxsteeppr.hpp
# Opt level: O2

SPxId __thiscall
soplex::SPxSteepPR<double>::buildBestPriceVectorEnterCoDim
          (SPxSteepPR<double> *this,double *best,double feastol)

{
  double dVar1;
  double dVar2;
  int iVar3;
  int iVar4;
  SPxSolverBase<double> *pSVar5;
  pointer pdVar6;
  pointer pdVar7;
  pointer pIVar8;
  int *piVar9;
  IdxElement *keys;
  uint uVar10;
  DataKey DVar11;
  ulong uVar12;
  long lVar13;
  double dVar14;
  IdxElement price;
  
  pSVar5 = (this->super_SPxPricer<double>).thesolver;
  pdVar6 = (pSVar5->theTest).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pdVar7 = (pSVar5->weights).val.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  pIVar8 = (this->pricesCo).data.
           super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((this->pricesCo).data.
      super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
      ._M_impl.super__Vector_impl_data._M_finish != pIVar8) {
    (this->pricesCo).data.
    super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
    ._M_impl.super__Vector_impl_data._M_finish = pIVar8;
  }
  (this->bestPricesCo).super_IdxSet.num = 0;
  for (uVar12 = (ulong)(uint)(pSVar5->infeasibilitiesCo).super_IdxSet.num; 0 < (int)uVar12;
      uVar12 = uVar12 - 1) {
    pSVar5 = (this->super_SPxPricer<double>).thesolver;
    piVar9 = (pSVar5->infeasibilitiesCo).super_IdxSet.idx;
    iVar3 = piVar9[uVar12 - 1];
    dVar1 = pdVar6[iVar3];
    if (-feastol <= dVar1) {
      iVar4 = (pSVar5->infeasibilitiesCo).super_IdxSet.num;
      (pSVar5->infeasibilitiesCo).super_IdxSet.num = iVar4 + -1;
      piVar9[uVar12 - 1] = piVar9[(long)iVar4 + -1];
      (pSVar5->isInfeasibleCo).data[iVar3] = 0;
    }
    else {
      (pSVar5->isInfeasibleCo).data[iVar3] = 1;
      dVar2 = pdVar7[iVar3];
      dVar14 = feastol;
      if (feastol <= dVar2) {
        dVar14 = dVar2;
      }
      price.val = (dVar1 * dVar1) / dVar14;
      price.idx = iVar3;
      std::
      vector<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
      ::push_back(&(this->pricesCo).data,&price);
    }
  }
  keys = (this->pricesCo).data.
         super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
         ._M_impl.super__Vector_impl_data._M_start;
  pIVar8 = (this->pricesCo).data.
           super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->super_SPxPricer<double>).compare.elements = keys;
  lVar13 = 0;
  uVar10 = SPxQuicksortPart<soplex::SPxPricer<double>::IdxElement,soplex::SPxPricer<double>::IdxCompare>
                     (keys,&(this->super_SPxPricer<double>).compare,0,
                      (int)((ulong)((long)pIVar8 - (long)keys) >> 4),100,0,0,true);
  uVar12 = 0;
  if (0 < (int)uVar10) {
    uVar12 = (ulong)uVar10;
  }
  for (; uVar12 * 0x10 != lVar13; lVar13 = lVar13 + 0x10) {
    DIdxSet::addIdx(&this->bestPricesCo,
                    *(int *)((long)&((this->pricesCo).data.
                                     super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->idx + lVar13));
    (((this->super_SPxPricer<double>).thesolver)->isInfeasibleCo).data
    [*(int *)((long)&((this->pricesCo).data.
                      super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
                      ._M_impl.super__Vector_impl_data._M_start)->idx + lVar13)] = 2;
  }
  if ((int)uVar10 < 1) {
    DVar11.info = 0;
    DVar11.idx = -1;
  }
  else {
    pIVar8 = (this->pricesCo).data.
             super__Vector_base<soplex::SPxPricer<double>::IdxElement,_std::allocator<soplex::SPxPricer<double>::IdxElement>_>
             ._M_impl.super__Vector_impl_data._M_start;
    *best = pIVar8->val;
    DVar11 = (DataKey)SPxSolverBase<double>::id
                                ((this->super_SPxPricer<double>).thesolver,pIVar8->idx);
  }
  return (SPxId)DVar11;
}

Assistant:

SPxId SPxSteepPR<R>::buildBestPriceVectorEnterCoDim(R& best, R feastol)
{
   const R* test        = this->thesolver->test().get_const_ptr();
   const R* weights_ptr = this->thesolver->weights.get_const_ptr();
   int idx;
   int nsorted;
   R x;
   typename SPxPricer<R>::IdxElement price;

   pricesCo.clear();
   bestPricesCo.clear();

   // construct vector of all prices
   for(int i = this->thesolver->infeasibilitiesCo.size() - 1; i >= 0; --i)
   {
      idx = this->thesolver->infeasibilitiesCo.index(i);
      x = test[idx];

      if(x < -feastol)
      {
         // it might happen that we call the pricer with a tighter tolerance than what was used when computing the violations
         this->thesolver->isInfeasibleCo[idx] = this->VIOLATED;
         price.val = steeppr::computePrice(x, weights_ptr[idx], feastol);
         price.idx = idx;
         pricesCo.append(price);
      }
      else
      {
         this->thesolver->infeasibilitiesCo.remove(i);
         this->thesolver->isInfeasibleCo[idx] = this->NOT_VIOLATED;
      }
   }

#ifndef NDEBUG

   if(std::is_floating_point<R>::value)
   {
      for(int i = 0; i < pricesCo.size(); ++i)
      {
         // nan values cannot be handled in sorting
         assert(!isnan(pricesCo[i].val));
         // inf values indicate numerical troubles, which should be handled beforehand
         assert(!isinf(pricesCo[i].val));
      }
   }

#endif

   // set up structures for the quicksort implementation
   this->compare.elements = pricesCo.get_const_ptr();
   // do a partial sort to move the best ones to the front
   // TODO this can be done more efficiently, since we only need the indices
   nsorted = SPxQuicksortPart(pricesCo.get_ptr(), this->compare, 0, pricesCo.size(),
                              SOPLEX_HYPERPRICINGSIZE);

   // copy indices of best values to bestPrices
   for(int i = 0; i < nsorted; ++i)
   {
      bestPricesCo.addIdx(pricesCo[i].idx);
      this->thesolver->isInfeasibleCo[pricesCo[i].idx] = this->VIOLATED_AND_CHECKED;
   }

   if(nsorted > 0)
   {
      best = pricesCo[0].val;
      return this->thesolver->id(pricesCo[0].idx);
   }
   else
      return SPxId();
}